

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsluv.c
# Opt level: O3

void xyz2rgb(Triplet *in_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_18;
  
  dVar1 = in_out->a;
  dVar3 = in_out->b;
  dVar2 = in_out->c;
  local_18 = dVar2 * -0.4986107602930033 + dVar1 * 3.2409699419045213 + dVar3 * -1.5373831775700935;
  if (local_18 <= 0.0031308) {
    local_18 = local_18 * 12.92;
  }
  else {
    dVar1 = pow(local_18,0.4166666666666667);
    local_18 = dVar1 * 1.055 + -0.055;
    dVar1 = in_out->a;
    dVar3 = in_out->b;
    dVar2 = in_out->c;
  }
  dVar4 = dVar2 * 0.04155505740717561 + dVar1 * -0.9692436362808798 + dVar3 * 1.8759675015077206;
  if (dVar4 <= 0.0031308) {
    dVar4 = dVar4 * 12.92;
  }
  else {
    dVar1 = pow(dVar4,0.4166666666666667);
    dVar4 = dVar1 * 1.055 + -0.055;
    dVar1 = in_out->a;
    dVar3 = in_out->b;
    dVar2 = in_out->c;
  }
  dVar1 = dVar2 * 1.0569715142428786 + dVar1 * 0.05563007969699361 + dVar3 * -0.20397695888897657;
  if (dVar1 <= 0.0031308) {
    dVar1 = dVar1 * 12.92;
  }
  else {
    dVar1 = pow(dVar1,0.4166666666666667);
    dVar1 = dVar1 * 1.055 + -0.055;
  }
  in_out->a = local_18;
  in_out->b = dVar4;
  in_out->c = dVar1;
  return;
}

Assistant:

static void
xyz2rgb(Triplet* in_out)
{
    double r = from_linear(dot_product(&m[0], in_out));
    double g = from_linear(dot_product(&m[1], in_out));
    double b = from_linear(dot_product(&m[2], in_out));
    in_out->a = r;
    in_out->b = g;
    in_out->c = b;
}